

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcTerminatorSymbol::~IfcTerminatorSymbol(IfcTerminatorSymbol *this)

{
  ~IfcTerminatorSymbol
            ((IfcTerminatorSymbol *)
             (&(this->super_IfcAnnotationSymbolOccurrence).super_IfcAnnotationOccurrence.
               super_IfcStyledItem.field_0x0 +
             *(long *)(*(long *)&(this->super_IfcAnnotationSymbolOccurrence).
                                 super_IfcAnnotationOccurrence.super_IfcStyledItem + -0x18)));
  return;
}

Assistant:

IfcTerminatorSymbol() : Object("IfcTerminatorSymbol") {}